

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteTable(WatWriter *this,Table *table)

{
  string_view local_28;
  Table *local_18;
  Table *table_local;
  WatWriter *this_local;
  
  local_18 = table;
  table_local = (Table *)this;
  WriteOpenSpace(this,"table");
  string_view::string_view(&local_28,&local_18->name);
  WriteNameOrIndex(this,local_28,this->table_index_,Space);
  WriteInlineExports(this,Table,this->table_index_);
  WriteInlineImport(this,Table,this->table_index_);
  WriteLimits(this,&local_18->elem_limits);
  WritePutsSpace(this,"anyfunc");
  WriteCloseNewline(this);
  this->table_index_ = this->table_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteTable(const Table& table) {
  WriteOpenSpace("table");
  WriteNameOrIndex(table.name, table_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Table, table_index_);
  WriteInlineImport(ExternalKind::Table, table_index_);
  WriteLimits(table.elem_limits);
  WritePutsSpace("anyfunc");
  WriteCloseNewline();
  table_index_++;
}